

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Ses_ManFindNetworkExactCEGAR(Ses_Man_t *pSes,int nGates,char **pSol)

{
  word *__s;
  char cVar1;
  byte bVar2;
  int iVar3;
  word *pwVar4;
  ulong uVar5;
  int iVar6;
  ulong *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  word *pwVar11;
  char *pcVar12;
  word *pwVar13;
  long lVar14;
  byte *pbVar15;
  ulong uVar16;
  bool bVar17;
  word pTruth [4];
  ulong local_58 [5];
  
  if (pSes->fVeryVerbose != 0) {
    iVar8 = pSes->nDebugOffset + (uint)(10 < nGates) + 4;
    if (0 < iVar8) {
      do {
        putchar(8);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    fflush(_stdout);
  }
  uVar9 = pSes->nMaxDepth;
  if (nGates < 1 << ((byte)uVar9 & 0x1f) || uVar9 == 0xffffffff) {
    if (((uVar9 == 0xffffffff) || (pSes->pArrTimeProfile == (int *)0x0)) ||
       (nGates <= pSes->nMaxGates)) {
      if ((pSes->fDecStructure == 0) || (nGates <= 1 << ((byte)uVar9 - 1 & 0x1f))) {
        if (1 << ((byte)pSes->nSpecVars & 0x1f) <= nGates) {
          if (pSes->fReasonVerbose == 0) {
            return 3;
          }
          printf("give up due to impossible number of gates");
          return 3;
        }
        if (0 < pSes->nRandRowAssigns) {
          iVar8 = 0;
          do {
            iVar3 = rand();
            lVar14 = (long)iVar3 % (long)pSes->nRows;
            pSes->pTtValues[(int)lVar14 >> 6] =
                 pSes->pTtValues[(int)lVar14 >> 6] | 1L << ((byte)lVar14 & 0x3f);
            iVar8 = iVar8 + 1;
          } while (iVar8 < pSes->nRandRowAssigns);
        }
        iVar8 = Ses_ManFindNetworkExact(pSes,nGates);
        if (iVar8 != 1) {
          return iVar8;
        }
        __s = pSes->pTtObjs;
        while( true ) {
          pcVar12 = Ses_ManExtractSolution(pSes);
          *pSol = pcVar12;
          if (pcVar12[1] != '\x01') {
            __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x404,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
          }
          cVar1 = pcVar12[2];
          uVar9 = (uint)cVar1;
          pbVar15 = (byte *)(pcVar12 + 3);
          memset(__s,0,(long)(int)uVar9 << 5);
          if (cVar1 < '\x01') {
            pwVar4 = (word *)0x0;
          }
          else {
            pwVar4 = __s;
            uVar16 = 0;
            do {
              uVar10 = uVar16;
              if (pbVar15[1] != 2) {
                __assert_fail("*p++ == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                              ,0x40d,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
              }
              iVar3 = (int)(char)pbVar15[2];
              iVar8 = pSes->nSpecVars;
              if (iVar3 < iVar8) {
                pwVar11 = s_Truths8 + (long)iVar3 * 4;
              }
              else {
                pwVar11 = __s + (iVar3 - iVar8) * 4;
              }
              iVar3 = (int)(char)pbVar15[3];
              if (iVar3 < iVar8) {
                pwVar13 = s_Truths8 + (long)iVar3 * 4;
              }
              else {
                pwVar13 = __s + (iVar3 - iVar8) * 4;
              }
              bVar2 = *pbVar15;
              if (((bVar2 & 1) != 0) && (iVar8 = pSes->nSpecWords, 0 < (long)iVar8)) {
                lVar14 = 0;
                do {
                  pwVar4[lVar14] = pwVar4[lVar14] | ~pwVar11[lVar14] & pwVar13[lVar14];
                  lVar14 = lVar14 + 1;
                } while (iVar8 != lVar14);
              }
              if (((bVar2 & 2) != 0) && (iVar8 = pSes->nSpecWords, 0 < (long)iVar8)) {
                lVar14 = 0;
                do {
                  pwVar4[lVar14] = pwVar4[lVar14] | ~pwVar13[lVar14] & pwVar11[lVar14];
                  lVar14 = lVar14 + 1;
                } while (iVar8 != lVar14);
              }
              if (((bVar2 & 4) != 0) && (iVar8 = pSes->nSpecWords, 0 < (long)iVar8)) {
                lVar14 = 0;
                do {
                  pwVar4[lVar14] = pwVar4[lVar14] | pwVar13[lVar14] & pwVar11[lVar14];
                  lVar14 = lVar14 + 1;
                } while (iVar8 != lVar14);
              }
              pbVar15 = pbVar15 + 4;
              uVar16 = uVar10 + 1;
              pwVar4 = pwVar4 + 4;
            } while (uVar16 != uVar9);
            pwVar4 = __s + uVar10 * 4;
          }
          if ((char)*pbVar15 < '\0') {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (uVar9 - 1 != (uint)(*pbVar15 >> 1)) {
            __assert_fail("Abc_Lit2Var( *p ) == nGates - 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x421,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
          }
          iVar8 = pSes->nSpecWords;
          if (0 < (long)iVar8) {
            pwVar11 = pSes->pSpec;
            lVar14 = 0;
            do {
              local_58[lVar14] = pwVar11[lVar14] ^ pwVar4[lVar14];
              lVar14 = lVar14 + 1;
            } while (iVar8 != lVar14);
          }
          iVar8 = pSes->nSpecVars;
          uVar9 = 1 << ((char)iVar8 - 6U & 0x1f);
          if (iVar8 < 7) {
            uVar9 = 1;
          }
          if ((int)uVar9 < 1) {
            return 1;
          }
          puVar7 = local_58;
          uVar16 = 0;
          while (uVar10 = *puVar7, uVar10 == 0) {
            uVar16 = uVar16 - 0x40;
            puVar7 = puVar7 + 1;
            if ((ulong)uVar9 * 0x40 + uVar16 == 0) {
              return 1;
            }
          }
          bVar17 = (int)uVar10 == 0;
          uVar5 = uVar10 >> 0x20;
          if (!bVar17) {
            uVar5 = uVar10;
          }
          iVar6 = (uint)bVar17 * 0x20;
          iVar3 = iVar6 + 0x10;
          uVar10 = uVar5 >> 0x10;
          if ((short)uVar5 != 0) {
            iVar3 = iVar6;
            uVar10 = uVar5;
          }
          iVar6 = iVar3 + 8;
          uVar5 = uVar10 >> 8;
          if ((char)uVar10 != '\0') {
            iVar6 = iVar3;
            uVar5 = uVar10;
          }
          iVar3 = iVar6 + 4;
          uVar10 = uVar5 >> 4;
          if ((uVar5 & 0xf) != 0) {
            iVar3 = iVar6;
            uVar10 = uVar5;
          }
          uVar9 = (uint)(uVar10 >> 2) & 0x3fffffff;
          iVar6 = iVar3 + 2;
          if ((uVar10 & 3) != 0) {
            uVar9 = (uint)uVar10;
            iVar6 = iVar3;
          }
          if (((uVar9 & 1) - iVar6) + (int)uVar16 == 2) {
            return 1;
          }
          uVar9 = iVar6 + (uVar9 & 1 ^ 1);
          if ((iVar8 < 6) && (pSes->nRows < (int)(uVar9 - (int)uVar16))) {
            return 1;
          }
          if (*pSol != (char *)0x0) {
            free(*pSol);
            *pSol = (char *)0x0;
          }
          lVar14 = ~uVar16 + (ulong)uVar9;
          iVar8 = (int)lVar14;
          if (pSes->fKeepRowAssigns != 0) {
            pSes->pTtValues[iVar8 >> 6] = pSes->pTtValues[iVar8 >> 6] | 1L << ((byte)lVar14 & 0x3f);
          }
          iVar8 = Ses_ManCreateTruthTableClause(pSes,iVar8);
          if (iVar8 == 0) break;
          iVar8 = Ses_ManSolve(pSes);
          if (iVar8 != 1) {
            return (uint)(iVar8 != 2) * 2;
          }
        }
        return 2;
      }
      if (pSes->fReasonVerbose == 0) {
        return 3;
      }
      pcVar12 = "give up due to impossible depth in AND-dec structure (depth = %d, gates = %d)";
    }
    else {
      if (pSes->fReasonVerbose == 0) {
        return 3;
      }
      pcVar12 = "give up due to impossible depth and arrival times (depth = %d, gates = %d)";
    }
  }
  else {
    if (pSes->fReasonVerbose == 0) {
      return 3;
    }
    pcVar12 = "give up due to impossible depth (depth = %d, gates = %d)";
  }
  printf(pcVar12,(ulong)uVar9,(ulong)(uint)nGates);
  return 3;
}

Assistant:

static int Ses_ManFindNetworkExactCEGAR( Ses_Man_t * pSes, int nGates, char ** pSol )
{
    int fRes, iMint, fSat, i;
    word pTruth[4];

    /* debug */
    Abc_DebugErase( pSes->nDebugOffset + ( nGates > 10 ? 5 : 4 ), pSes->fVeryVerbose );
    Abc_DebugPrintIntInt( " (%d/%d)", nGates, pSes->nMaxGates, pSes->fVeryVerbose );

    /* do #gates and max depth allow for a network? */
    if ( !Ses_CheckGatesConsistency( pSes, nGates ) )
        return 3;

    for ( i = 0; i < pSes->nRandRowAssigns; ++i )
        Abc_TtSetBit( pSes->pTtValues, rand() % pSes->nRows );

    fRes = Ses_ManFindNetworkExact( pSes, nGates );
    if ( fRes != 1 ) return fRes;

    while ( true )
    {
        *pSol = Ses_ManExtractSolution( pSes );
        Abc_TtXor( pTruth, Ses_ManDeriveTruth( pSes, *pSol, 0 ), pSes->pSpec, pSes->nSpecWords, 0 );
        iMint = Abc_TtFindFirstBit( pTruth, pSes->nSpecVars );

        if ( iMint == -1 || (pSes->nSpecVars < 6 && iMint > pSes->nRows) )
        {
            assert( fRes == 1 );
            return 1;
        }
        ABC_FREE( *pSol );

        if ( pSes->fKeepRowAssigns )
            Abc_TtSetBit( pSes->pTtValues, iMint - 1 );
        if ( !Ses_ManCreateTruthTableClause( pSes, iMint - 1 ) ) /* UNSAT, continue */
            return 2;

        if ( ( fSat = Ses_ManSolve( pSes ) ) == 1 ) continue;

        return ( fSat == 2 ) ? 0 : 2;
    }
}